

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu580.c
# Opt level: O3

MPP_RET hal_h264e_vepu580_gen_regs(void *hal,HalEncTask *task)

{
  byte bVar1;
  MppFrameFormat format;
  void *__s;
  long lVar2;
  int *piVar3;
  EncRcTask *pEVar4;
  MppDevRegOffCfgs *cfgs;
  MppPacket s;
  MppFrame frame;
  undefined8 *puVar5;
  HalBufs bufs;
  long *plVar6;
  long *plVar7;
  ulong uVar8;
  short sVar9;
  Vepu541Fmt VVar10;
  undefined8 uVar11;
  ushort uVar12;
  MPP_RET MVar13;
  uint uVar14;
  uint uVar15;
  RK_U32 RVar16;
  RK_S32 RVar17;
  int iVar18;
  RK_U32 offset;
  VepuRgb2YuvCfg *pVVar19;
  MppBuffer pvVar20;
  undefined4 extraout_var;
  size_t sVar21;
  HalBuf *pHVar22;
  HalBuf *pHVar23;
  void *pvVar24;
  ushort *puVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  undefined2 uVar32;
  uint uVar33;
  RK_U32 RVar34;
  ulong uVar35;
  long lVar36;
  char *fmt;
  undefined4 uVar37;
  int iVar38;
  uint uVar39;
  RK_U32 *pRVar40;
  int iVar41;
  HalEncTask *pHVar42;
  MppBuffer pvVar43;
  RK_U32 *pRVar44;
  uint uVar45;
  int iVar46;
  short sVar47;
  int iVar48;
  bool bVar49;
  byte bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  H264eRplmo rplmo;
  VepuFmtCfg local_80;
  undefined8 local_58;
  ushort *local_50;
  HalEncTask *local_48;
  long local_40;
  MppFrameFormat local_34;
  
  bVar50 = 0;
  __s = *(void **)((long)hal + 0x1d0);
  lVar2 = *hal;
  piVar3 = *(int **)((long)hal + 0x60);
  lVar36 = *(long *)((long)hal + 0x68);
  lVar30 = *(long *)((long)hal + 0x1e8);
  pEVar4 = task->rc_task;
  local_48 = task;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter %p\n","hal_h264e_vepu580_gen_regs",hal);
  }
  if ((hal_h264e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","frame %d generate regs now","hal_h264e_vepu580_gen_regs",
               (ulong)**(uint **)((long)hal + 0x78));
  }
  uVar15 = 0;
  memset(__s,0,0x1cb8);
  if ((hal_h264e_debug & 2) == 0) {
    uVar35 = 0x8008007000;
    bVar49 = true;
    uVar14 = 0x100;
    uVar39 = 7;
    uVar26 = 0x1f7;
    uVar33 = 0;
  }
  else {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_normal");
    bVar49 = (hal_h264e_debug & 2) == 0;
    uVar14 = *(uint *)((long)__s + 0x10) & 0xfffffc00 | 0x100;
    uVar39 = *(uint *)((long)__s + 0x54) | 7;
    uVar33 = *(uint *)((long)__s + 0x14) & 0xfffffffc;
    uVar26 = *(uint *)((long)__s + 0x20) & 0xfffffe00 | 0x1f7;
    uVar15 = *(uint *)((long)__s + 0x24) & 0xfffffe00;
    uVar35 = *(ulong *)((long)__s + 0x30) & (ulong)DAT_002ad410 | DAT_002ad400;
  }
  *(uint *)((long)__s + 0x10) = uVar14;
  *(uint *)((long)__s + 0x54) = uVar39;
  *(uint *)((long)__s + 0x14) = uVar33;
  *(uint *)((long)__s + 0x20) = uVar26;
  *(uint *)((long)__s + 0x24) = uVar15;
  *(undefined4 *)((long)__s + 0x38) = 0x1fffff;
  *(ulong *)((long)__s + 0x30) = uVar35;
  local_40 = lVar30;
  if (!bVar49) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_normal");
  }
  lVar30 = *hal;
  format = *(MppFrameFormat *)(lVar30 + 0x24);
  MVar13 = vepu541_set_fmt(&local_80,format);
  uVar11 = local_80._0_8_;
  VVar10 = local_80.format;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_prep");
  }
  if (MVar13 != MPP_OK) {
    return MVar13;
  }
  uVar15 = *(uint *)((long)__s + 0xf0);
  uVar14 = (*(int *)(lVar30 + 0xc) + 0xfU >> 3 & 0x7fe) - 1 & 0x7ff;
  *(uint *)((long)__s + 0xf0) = uVar15 & 0xfffff800 | uVar14;
  uVar39 = *(uint *)((long)__s + 0xf4);
  uVar33 = (*(int *)(lVar30 + 0xc) + 0xfU & 0x30) - *(int *)(lVar30 + 0xc) & 0x3f;
  *(uint *)((long)__s + 0xf4) = uVar39 & 0xffffffc0 | uVar33;
  *(uint *)((long)__s + 0xf0) =
       uVar15 & 0xf800f800 | uVar14 |
       (*(int *)(lVar30 + 0x10) * 0x2000 + 0x1e000U & 0x7fe0000) + 0x7ff0000 & 0x7ff0000;
  *(uint *)((long)__s + 0xf4) =
       uVar39 & 0xffc0ffc0 | uVar33 |
       ((*(int *)(lVar30 + 0x10) + 0xfU & 0x30) - *(int *)(lVar30 + 0x10) & 0x3f) << 0x10;
  *(uint *)((long)__s + 0x30) =
       *(uint *)((long)__s + 0x30) & 0xffffff0f | (local_80.src_endian & 0xf) << 4;
  uVar15 = ((uint)(format != MPP_FMT_YUV400) * 0x80 +
            (VVar10 & (VEPU580_FMT_BUTT|VEPU541_FMT_BGR888)) * 4 |
            *(uint *)((long)__s + 0xf8) & 0xffffff40 | local_80.alpha_swap & 1) +
           (local_80.rbuv_swap & 1) * 2;
  *(uint *)((long)__s + 0xf8) = uVar15;
  if ((format & 0xfffc) < MPP_FMT_YUV_BUTT && (format & 0xf0000) == MPP_FMT_YUV420SP) {
    uVar15 = uVar15 | 0x40;
  }
  else {
    uVar15 = uVar15 & 0xffffffbf | (uint)(*(int *)(lVar30 + 0x34) == 2) << 6;
  }
  *(uint *)((long)__s + 0xf8) = uVar15;
  if ((format & 0xf00000) != MPP_FMT_YUV420SP) {
    RVar16 = mpp_frame_get_fbc_hdr_stride(local_48->frame);
    if (RVar16 == 0) {
      RVar16 = *(int *)(lVar30 + 0xc) + 0xfU & 0xfffffff0;
    }
    goto LAB_0021fa95;
  }
  RVar16 = *(RK_U32 *)(lVar30 + 0x14);
  if (RVar16 != 0) goto LAB_0021fa95;
  switch(uVar11 & 0xffffffff) {
  case 0:
    RVar16 = *(int *)(lVar30 + 0xc) << 2;
    break;
  case 1:
    RVar16 = *(int *)(lVar30 + 0xc) * 3;
    break;
  case 2:
  case 8:
  case 9:
    RVar16 = *(int *)(lVar30 + 0xc) * 2;
    goto LAB_0021fa95;
  default:
    RVar16 = *(RK_U32 *)(lVar30 + 0xc);
LAB_0021fa95:
    RVar34 = RVar16;
    switch(VVar10) {
    default:
      RVar34 = (int)RVar16 / 2;
      uVar32 = (undefined2)RVar34;
      if (VEPU541_FMT_BGR565 < VVar10) goto switchD_0021faaf_caseD_4;
      goto LAB_0022022f;
    case VEPU580_FMT_YUV444SP:
      RVar34 = RVar16 * 2;
    case VEPU541_FMT_YUV422SP:
    case VEPU541_FMT_YUV420SP:
    case VEPU580_FMT_YUV444P:
switchD_0021faaf_caseD_4:
      uVar32 = (undefined2)RVar34;
      uVar39 = *local_80.weight & 0x1ff;
      uVar15 = *(uint *)((long)__s + 0xfc);
      *(uint *)((long)__s + 0xfc) = uVar15 & 0xfffffe00 | uVar39;
      uVar14 = (local_80.weight[1] & 0x1ffU) << 9;
      *(uint *)((long)__s + 0xfc) = uVar15 & 0xfffc0000 | uVar39 | uVar14;
      *(uint *)((long)__s + 0xfc) =
           uVar15 & 0xf8000000 | uVar39 | uVar14 | (local_80.weight[2] & 0x1ffU) << 0x12;
      uVar39 = local_80.weight[3] & 0x1ff;
      uVar15 = *(uint *)((long)__s + 0x100);
      *(uint *)((long)__s + 0x100) = uVar15 & 0xfffffe00 | uVar39;
      uVar14 = (local_80.weight[4] & 0x1ffU) << 9;
      *(uint *)((long)__s + 0x100) = uVar15 & 0xfffc0000 | uVar39 | uVar14;
      *(uint *)((long)__s + 0x100) =
           uVar15 & 0xf8000000 | uVar39 | uVar14 | (local_80.weight[5] & 0x1ffU) << 0x12;
      uVar39 = local_80.weight[6] & 0x1ff;
      uVar15 = *(uint *)((long)__s + 0x104);
      *(uint *)((long)__s + 0x104) = uVar15 & 0xfffffe00 | uVar39;
      uVar14 = (local_80.weight[7] & 0x1ffU) << 9;
      *(uint *)((long)__s + 0x104) = uVar15 & 0xfffc0000 | uVar39 | uVar14;
      *(uint *)((long)__s + 0x104) =
           uVar15 & 0xf8000000 | uVar39 | uVar14 | (local_80.weight[8] & 0x1ffU) << 0x12;
      uVar39 = (*local_80.offset & 0x1fU) << 0x10;
      uVar15 = *(uint *)((long)__s + 0x108);
      *(uint *)((long)__s + 0x108) = uVar15 & 0xffe0ffff | uVar39;
      uVar15 = uVar15 & 0xffe000ff | uVar39 | (local_80.offset[1] & 0xffU) << 8;
      *(uint *)((long)__s + 0x108) = uVar15;
      *(uint *)((long)__s + 0x108) = CONCAT31((int3)(uVar15 >> 8),(char)local_80.offset[2]);
    }
    goto LAB_0021fc0a;
  }
  uVar32 = (undefined2)((int)RVar16 / 2);
LAB_0022022f:
  pVVar19 = get_rgb2yuv_cfg(*(MppFrameColorRange *)(lVar30 + 0x34),
                            *(MppFrameColorSpace *)(lVar30 + 0x28));
  bVar49 = true;
  if ((hal_h264e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","input color range %d colorspace %d","setup_vepu580_prep",
               (ulong)*(uint *)(lVar30 + 0x34),(ulong)*(uint *)(lVar30 + 0x28));
    bVar49 = (hal_h264e_debug & 4) == 0;
  }
  uVar39 = (ushort)(pVVar19->_2y).b_coeff & 0x1ff;
  uVar15 = *(uint *)((long)__s + 0xfc);
  *(uint *)((long)__s + 0xfc) = uVar15 & 0xfffffe00 | uVar39;
  uVar14 = ((ushort)(pVVar19->_2y).g_coeff & 0x1ff) << 9;
  *(uint *)((long)__s + 0xfc) = uVar15 & 0xfffc0000 | uVar39 | uVar14;
  *(uint *)((long)__s + 0xfc) =
       uVar15 & 0xf8000000 | uVar39 | uVar14 | ((ushort)(pVVar19->_2y).r_coeff & 0x1ff) << 0x12;
  uVar39 = (ushort)(pVVar19->_2u).b_coeff & 0x1ff;
  uVar15 = *(uint *)((long)__s + 0x100);
  *(uint *)((long)__s + 0x100) = uVar15 & 0xfffffe00 | uVar39;
  uVar14 = ((ushort)(pVVar19->_2u).g_coeff & 0x1ff) << 9;
  *(uint *)((long)__s + 0x100) = uVar15 & 0xfffc0000 | uVar39 | uVar14;
  *(uint *)((long)__s + 0x100) =
       uVar15 & 0xf8000000 | uVar39 | uVar14 | ((ushort)(pVVar19->_2u).r_coeff & 0x1ff) << 0x12;
  uVar15 = *(uint *)((long)__s + 0x104);
  uVar39 = (ushort)(pVVar19->_2v).b_coeff & 0x1ff;
  *(uint *)((long)__s + 0x104) = uVar15 & 0xfffffe00 | uVar39;
  uVar14 = ((ushort)(pVVar19->_2v).g_coeff & 0x1ff) << 9;
  *(uint *)((long)__s + 0x104) = uVar15 & 0xfffc0000 | uVar39 | uVar14;
  *(uint *)((long)__s + 0x104) =
       uVar15 & 0xf8000000 | uVar39 | uVar14 | ((ushort)(pVVar19->_2v).r_coeff & 0x1ff) << 0x12;
  uVar15 = *(uint *)((long)__s + 0x108);
  uVar39 = ((ushort)(pVVar19->_2y).offset & 0x1f) << 0x10;
  *(uint *)((long)__s + 0x108) = uVar15 & 0xffe0ffff | uVar39;
  uVar15 = uVar15 & 0xffe000ff | uVar39 | ((ushort)(pVVar19->_2u).offset & 0xff) << 8;
  *(uint *)((long)__s + 0x108) = uVar15;
  *(uint *)((long)__s + 0x108) = CONCAT31((int3)(uVar15 >> 8),(char)(pVVar19->_2v).offset);
  if (!bVar49) {
    _mpp_log_l(4,"hal_h264e_vepu580","use color range %d colorspace %d","setup_vepu580_prep",
               (ulong)pVVar19->dst_range,(ulong)pVVar19->color);
  }
LAB_0021fc0a:
  uVar39 = (uint)((format & 0xf00000) != MPP_FMT_YUV420SP) << 0x1e;
  uVar15 = *(uint *)((long)__s + 0x10c);
  *(uint *)((long)__s + 0x10c) = uVar15 & 0xbfffffff | uVar39;
  *(uint *)((long)__s + 0x114) = *(uint *)((long)__s + 0x114) & 0xfffe0000 | RVar16 & 0x1ffff;
  *(undefined2 *)((long)__s + 0x118) = uVar32;
  uVar14 = (uint)(0 < *(int *)(lVar30 + 0x58)) << 0x1a;
  *(uint *)((long)__s + 0x10c) = uVar15 & 0xbbffffff | uVar39 | uVar14;
  *(uint *)((long)__s + 0x10c) =
       uVar15 & 0x83ffffff | uVar39 | uVar14 | (*(uint *)(lVar30 + 0x50) & 3) << 0x1b;
  *(byte *)((long)__s + 0x1d3) = *(byte *)((long)__s + 0x1d3) | 0x80;
  *(uint *)((long)__s + 0x110) = *(uint *)((long)__s + 0x110) & 0xc000c000;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_prep");
  }
  lVar30 = local_40;
  if (*(int *)((long)hal + 0x14) != 1) {
    lVar31 = *(long *)((long)hal + 0x1d0);
    if (*(int *)(local_40 + 0x2c) == 2) {
      *(undefined8 *)((long)hal + 0x1c4) = 0;
      uVar15 = 0x90010;
      uVar39 = 0;
    }
    else {
      uVar39 = *(uint *)((long)hal + 0x1c4) & 3;
      uVar15 = 0x90030;
    }
    uVar14 = *(uint *)(lVar31 + 0xe4);
    *(uint *)(lVar31 + 0xe4) = uVar14 & 0xfffffffc | uVar39;
    *(uint *)(lVar31 + 0xe4) =
         (uVar14 & 0xf800ffc0 | uVar39 | uVar15) + (*(uint *)((long)hal + 0x1c8) & 3) * 4;
    iVar29 = *(int *)((long)hal + 0x1c4);
    *(int *)((long)hal + 0x1c4) = iVar29 + 1;
    *(int *)((long)hal + 0x1c8) = iVar29;
    if (2 < iVar29) {
      *(undefined4 *)((long)hal + 0x1c4) = 0;
    }
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_codec");
  }
  uVar15 = *(uint *)((long)__s + 0xe0);
  uVar39 = *(uint *)((long)__s + 400);
  *(uint *)((long)__s + 0xe0) = uVar15 & 0xfffffffe;
  *(uint *)((long)__s + 0xe0) =
       (uVar15 & 0xffffffea) + (uint)(0 < *(int *)(lVar30 + 0x20)) * 4 + 0x10;
  uVar15 = *(uint *)(lVar30 + 0x20) & 3;
  *(uint *)((long)__s + 400) = uVar39 & 0xfffffffc | uVar15;
  *(uint *)((long)__s + 400) =
       (uVar39 & 0xffffff80 | uVar15) + (*(uint *)(lVar30 + 0x24) & 0x1f) * 4;
  uVar15 = *(uint *)((long)__s + 0x194);
  uVar39 = piVar3[10] & 0xf;
  *(uint *)((long)__s + 0x194) = uVar15 & 0xfffffff0 | uVar39;
  uVar14 = (piVar3[0x12] & 1U) << 4;
  *(uint *)((long)__s + 0x194) = uVar15 & 0xffffffe0 | uVar39 | uVar14;
  *(uint *)((long)__s + 0x194) = uVar15 & 0xfffffe00 | uVar39 | uVar14 | (piVar3[0xc] & 0xfU) << 5;
  uVar15 = *(uint *)((long)__s + 0x198);
  uVar39 = *(uint *)(lVar36 + 8) & 1;
  *(uint *)((long)__s + 0x198) = uVar15 & 0xfffffffe | uVar39;
  uVar15 = (uVar15 & 0xfffffffc | uVar39) + (*(uint *)(lVar36 + 0x44) & 1) * 2;
  *(uint *)((long)__s + 0x198) = uVar15;
  uVar15 = (uVar15 & 0xfffffffb) + (*(uint *)(lVar36 + 0x3c) & 1) * 4;
  *(uint *)((long)__s + 0x198) = uVar15;
  uVar39 = *(int *)(lVar36 + 0x14) * 8 + 0x18U & 0x18;
  *(uint *)((long)__s + 0x198) = uVar15 & 0xffffffe7 | uVar39;
  uVar14 = *(int *)(lVar36 + 0x18) * 0x20 + 0x60U & 0x60;
  *(uint *)((long)__s + 0x198) = uVar15 & 0xffffff87 | uVar39 | uVar14;
  uVar33 = (*(uint *)(lVar36 + 0x24) & 0x3f) << 7;
  *(uint *)((long)__s + 0x198) = uVar15 & 0xffffe007 | uVar39 | uVar14 | uVar33;
  uVar26 = (*(uint *)(lVar36 + 0x2c) & 0x1f) << 0xd;
  *(uint *)((long)__s + 0x198) = uVar15 & 0xfffc0007 | uVar39 | uVar14 | uVar33 | uVar26;
  uVar27 = (*(uint *)(lVar36 + 0x34) & 0x1f) << 0x12;
  *(uint *)((long)__s + 0x198) = uVar15 & 0xff800007 | uVar39 | uVar14 | uVar33 | uVar26 | uVar27;
  uVar28 = (*(uint *)(lVar36 + 0x1c) & 1) << 0x17;
  *(uint *)((long)__s + 0x198) =
       uVar15 & 0xff000007 | uVar39 | uVar14 | uVar33 | uVar26 | uVar27 | uVar28;
  *(uint *)((long)__s + 0x198) =
       uVar15 & 0xfe000007 | uVar39 | uVar14 | uVar33 | uVar26 | uVar27 | uVar28 |
       (*(uint *)(lVar36 + 0x38) & 1) << 0x18;
  uVar15 = (*(uint *)((long)__s + 0x19c) & 0xfffffffc) + (uint)(*(int *)(lVar30 + 0x2c) == 2) * 2;
  *(uint *)((long)__s + 0x19c) = uVar15;
  uVar15 = (uVar15 & 0xfffff802) + (*(uint *)(lVar30 + 0x30) & 0xff) * 4;
  *(uint *)((long)__s + 0x19c) = uVar15;
  uVar39 = (*(uint *)(lVar30 + 0x38) & 1) << 0xb;
  *(uint *)((long)__s + 0x19c) = uVar15 & 0xfffff3fe | uVar39;
  uVar14 = (*(uint *)(lVar30 + 0x40) & 3) << 0xc;
  *(uint *)((long)__s + 0x19c) = uVar15 & 0xffffc3fe | uVar39 | uVar14;
  *(uint *)((long)__s + 0x19c) = uVar15 & 0xc3fe | uVar39 | uVar14 | *(int *)(lVar30 + 0x34) << 0x10
  ;
  uVar15 = 0xffff;
  if (*(int *)(lVar30 + 0x2c) == 2) {
    uVar15 = (uint)*(ushort *)(lVar30 + 0x6c);
  }
  *(short *)((long)__s + 0x1a0) = (short)uVar15;
  *(uint *)((long)__s + 0x1a0) = *(int *)(lVar30 + 0x74) << 0x10 | uVar15;
  uVar39 = (*(uint *)(lVar30 + 0x44) & 3) << 0xb;
  uVar15 = *(uint *)((long)__s + 0x1a4);
  *(uint *)((long)__s + 0x1a4) = uVar15 & 0xffffe7ff | uVar39;
  *(uint *)((long)__s + 0x1a4) =
       uVar15 & 0xffffe07f | uVar39 | (*(uint *)(lVar30 + 0x48) & 0xf) << 7;
  h264e_reorder_rd_rewind(*(H264eReorderInfo **)(lVar30 + 0x58));
  MVar13 = h264e_reorder_rd_op(*(H264eReorderInfo **)(lVar30 + 0x58),(H264eRplmo *)&local_80);
  if (MVar13 == MPP_OK) {
    uVar15 = (local_80.format & VEPU541_FMT_NONE) + (*(uint *)((long)__s + 0x1a4) & 0xfffffff8) + 4;
    *(uint *)((long)__s + 0x1a4) = uVar15;
    if (local_80.format < VEPU541_FMT_BGR565) {
      RVar16 = local_80.alpha_swap;
    }
    else {
      RVar16 = local_80.rbuv_swap;
      if (local_80.format != VEPU541_FMT_BGR565) {
        _mpp_log_l(2,"hal_h264e_vepu580","invalid modification_of_pic_nums_idc %d\n",
                   "setup_vepu580_codec");
        goto LAB_00220073;
      }
    }
    *(uint *)((long)__s + 0x1a4) = uVar15 & 0xffff | RVar16 << 0x10;
  }
  else {
    *(uint *)((long)__s + 0x1a4) = *(uint *)((long)__s + 0x1a4) & 0xfff8;
  }
LAB_00220073:
  *(uint *)((long)__s + 0x1a8) = *(uint *)((long)__s + 0x1a8) & 0xe0000000;
  *(undefined4 *)((long)__s + 0x1ac) = 0;
  *(uint *)((long)__s + 0x1b0) = *(uint *)((long)__s + 0x1b0) & 0xfffff000;
  h264e_marking_rd_rewind(*(H264eMarkingInfo **)(lVar30 + 0x60));
  if (*(int *)(lVar30 + 0x2c) == 2) {
    uVar15 = *(uint *)((long)__s + 0x1a8);
    uVar39 = *(uint *)(lVar30 + 0x7c) & 1;
    *(uint *)((long)__s + 0x1a8) = uVar15 & 0xfffffffe | uVar39;
    *(uint *)((long)__s + 0x1a8) =
         (uVar15 & 0xfffffffc | uVar39) + (*(uint *)(lVar30 + 0x80) & 1) * 2;
  }
  else {
    RVar17 = h264e_marking_is_empty(*(H264eMarkingInfo **)(lVar30 + 0x60));
    if (RVar17 == 0) {
      *(byte *)((long)__s + 0x1a8) = *(byte *)((long)__s + 0x1a8) | 4;
      h264e_marking_rd_op(*(H264eMarkingInfo **)(lVar30 + 0x60),(H264eMmco *)&local_80);
      uVar39 = 0;
      uVar15 = 0;
      RVar16 = local_80.alpha_swap;
      switch(local_80.format) {
      case VEPU541_FMT_BGR888:
        uVar14 = 0x10;
        break;
      case VEPU541_FMT_BGR565:
        uVar14 = 0x20;
        RVar16 = local_80.rbuv_swap;
        break;
      case VEPU541_FMT_NONE:
        uVar15 = local_80.src_range & 0xf;
        uVar14 = 0x30;
        break;
      case VEPU541_FMT_YUV422SP:
        uVar14 = 0x40;
        uVar15 = uVar39;
        RVar16 = local_80.src_endian;
        break;
      case VEPU541_FMT_YUV422P:
        uVar14 = 0x50;
        RVar16 = 0;
        uVar15 = uVar39;
        break;
      case VEPU541_FMT_YUV420SP:
        uVar14 = 0x60;
        uVar15 = uVar39;
        RVar16 = local_80.src_range;
        break;
      default:
        uVar14 = 0;
        _mpp_log_l(2,"hal_h264e_vepu580","unsupported mmco 0 %d\n","setup_vepu580_codec");
        uVar15 = 0;
        RVar16 = 0;
      }
      *(RK_U32 *)((long)__s + 0x1a8) =
           (RVar16 & 0xffff) << 7 | uVar14 | *(uint *)((long)__s + 0x1a8) & 0xff80000f;
      *(uint *)((long)__s + 0x1b0) = *(uint *)((long)__s + 0x1b0) & 0xfffffff0 | uVar15;
      RVar17 = h264e_marking_is_empty(*(H264eMarkingInfo **)(lVar30 + 0x60));
      if (RVar17 == 0) {
        h264e_marking_rd_op(*(H264eMarkingInfo **)(lVar30 + 0x60),(H264eMmco *)&local_80);
        uVar39 = 0;
        uVar15 = 0;
        switch(local_80.format) {
        case VEPU541_FMT_BGR888:
          uVar14 = (uint)(ushort)local_80.alpha_swap;
          uVar37 = 0x800000;
          break;
        case VEPU541_FMT_BGR565:
          uVar14 = local_80.rbuv_swap & 0xffff;
          uVar37 = 0x1000000;
          break;
        case VEPU541_FMT_NONE:
          uVar14 = (uint)(ushort)local_80.alpha_swap;
          uVar15 = (local_80.src_range & 0xf) << 4;
          uVar37 = 0x1800000;
          break;
        case VEPU541_FMT_YUV422SP:
          uVar14 = local_80.src_endian & 0xffff;
          uVar37 = 0x2000000;
          uVar15 = uVar39;
          break;
        case VEPU541_FMT_YUV422P:
          uVar37 = 0x2800000;
          uVar14 = 0;
          uVar15 = uVar39;
          break;
        case VEPU541_FMT_YUV420SP:
          uVar14 = local_80.src_range & 0xffff;
          uVar37 = 0x3000000;
          uVar15 = uVar39;
          break;
        default:
          uVar37 = 0;
          _mpp_log_l(2,"hal_h264e_vepu580","unsupported mmco 0 %d\n","setup_vepu580_codec");
          uVar14 = 0;
          uVar15 = 0;
        }
        *(ulong *)((long)__s + 0x1a8) =
             CONCAT44(uVar14,uVar37) | *(ulong *)((long)__s + 0x1a8) & (ulong)DAT_002acb40;
        *(uint *)((long)__s + 0x1b0) = *(uint *)((long)__s + 0x1b0) & 0xffffff0f | uVar15;
        RVar17 = h264e_marking_is_empty(*(H264eMarkingInfo **)(lVar30 + 0x60));
        if (RVar17 == 0) {
          h264e_marking_rd_op(*(H264eMarkingInfo **)(lVar30 + 0x60),(H264eMmco *)&local_80);
          uVar39 = 0;
          uVar15 = 0;
          switch(local_80.format) {
          case VEPU541_FMT_BGR888:
            uVar37 = 0x4000000;
            local_80.src_range = local_80.alpha_swap;
            break;
          case VEPU541_FMT_BGR565:
            uVar37 = 0x8000000;
            local_80.src_range = local_80.rbuv_swap;
            break;
          case VEPU541_FMT_NONE:
            uVar15 = (local_80.src_range & 0xf) << 8;
            uVar37 = 0xc000000;
            local_80.src_range = local_80.alpha_swap;
            break;
          case VEPU541_FMT_YUV422SP:
            uVar37 = 0x10000000;
            uVar15 = uVar39;
            local_80.src_range = local_80.src_endian;
            break;
          case VEPU541_FMT_YUV422P:
            uVar37 = 0x14000000;
            local_80.src_range = 0;
            uVar15 = uVar39;
            break;
          case VEPU541_FMT_YUV420SP:
            uVar37 = 0x18000000;
            uVar15 = uVar39;
            break;
          default:
            uVar37 = 0;
            _mpp_log_l(2,"hal_h264e_vepu580","unsupported mmco 0 %d\n","setup_vepu580_codec");
            local_80.src_range = 0;
            uVar15 = 0;
          }
          *(ulong *)((long)__s + 0x1a8) =
               CONCAT44(local_80.src_range << 0x10,uVar37) |
               *(ulong *)((long)__s + 0x1a8) & (ulong)DAT_002acb50;
          *(uint *)((long)__s + 0x1b0) = *(uint *)((long)__s + 0x1b0) & 0xfffff0ff | uVar15;
        }
      }
    }
  }
  if (((hal_h264e_debug & 2) != 0) &&
     (_mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_codec"), (hal_h264e_debug & 2) != 0)
     ) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_rdo_pred");
  }
  uVar15 = *(uint *)((long)__s + 600) & 0xfffffff8;
  if (*(int *)(lVar30 + 0x2c) == 2) {
    pRVar40 = h264e_klut_weight;
  }
  else {
    uVar15 = uVar15 | 3;
    pRVar40 = h264e_klut_weight + 4;
  }
  pRVar44 = (RK_U32 *)((long)__s + 0x25c);
  for (lVar30 = 0x18; lVar30 != 0; lVar30 = lVar30 + -1) {
    *pRVar44 = *pRVar40;
    pRVar40 = pRVar40 + (ulong)bVar50 * -2 + 1;
    pRVar44 = pRVar44 + (ulong)bVar50 * -2 + 1;
  }
  *(uint *)((long)__s + 600) = uVar15;
  *(uint *)((long)__s + 0x184) = *(uint *)((long)__s + 0x184) & 0xf000f000 | 0x3f0009;
  uVar15 = 2;
  if (*piVar3 == 0x42) {
    uVar15 = piVar3[7] < 0x1f | 2;
  }
  uVar39 = *(uint *)((long)__s + 0x180);
  *(uint *)((long)__s + 0x180) = uVar39 & 0xfffffffc | uVar15;
  iVar29 = 0;
  if (*piVar3 < 0x4d) {
    iVar29 = (uint)(*(int *)(lVar36 + 8) == 0) << 3;
  }
  uVar15 = (uVar39 & 0xffffc004 | uVar15) + iVar29 + 0x2010;
  *(uint *)((long)__s + 0x180) = uVar15;
  *(uint *)((long)__s + 0x180) =
       (uVar15 & 0xffc7601f) + (*(uint *)(lVar36 + 0x48) & 3) * 0x100000 + 0x88000;
  if (((hal_h264e_debug & 2) != 0) &&
     (_mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_rdo_pred"),
     (hal_h264e_debug & 2) != 0)) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_rdo_cfg");
  }
  *(byte *)((long)__s + 0x58c) = *(byte *)((long)__s + 0x58c) | 1;
  *(uint *)((long)__s + 0x658) = *(uint *)((long)__s + 0x658) & 0xf000f000 | 0x2c001c;
  *(uint *)((long)__s + 0x65c) = *(uint *)((long)__s + 0x65c) & 0xfffff000 | 0x48;
  *(uint *)((long)__s + 0x660) = *(uint *)((long)__s + 0x660) & 0xf000f000 | 0x400019;
  *(uint *)((long)__s + 0x664) = *(uint *)((long)__s + 0x664) & 0xf000f000 | 0x400019;
  auVar51 = *(undefined1 (*) [16])((long)__s + 0x668) & _DAT_002ad440;
  *(undefined1 (*) [16])((long)__s + 0x668) = _DAT_002ad450 | auVar51;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)((long)__s + 0x678);
  auVar53 = auVar53 & ZEXT816(0xff000000ff000000);
  *(ulong *)((long)__s + 0x678) = auVar53._0_8_ | 0x10101000121314;
  *(uint *)((long)__s + 0x6a8) = *(uint *)((long)__s + 0x6a8) & 0xf000f000 | 0x8000a;
  *(uint *)((long)__s + 0x6ac) = *(uint *)((long)__s + 0x6ac) & 0xf000f000 | 0x19000f;
  *(uint *)((long)__s + 0x6b0) = *(uint *)((long)__s + 0x6b0) & 0xf000f000 | 0x280019;
  *(uint *)((long)__s + 0x6b4) = *(uint *)((long)__s + 0x6b4) & 0xf000f000 | 0x280019;
  *(ulong *)((long)__s + 0x6b8) =
       *(ulong *)((long)__s + 0x6b8) & 0xf000f000f000f000 | u_FdFd_002ad4b0._0_8_;
  *(undefined4 *)((long)__s + 0x6c0) = 0x10101014;
  *(ulong *)((long)__s + 0x6c4) =
       *(ulong *)((long)__s + 0x6c4) & 0xff000000ff000000 | (ulong)DAT_002ad4c0;
  *(uint *)((long)__s + 0x6cc) = (uint)*(byte *)((long)__s + 0x6cf) << 0x18 | 0x101010;
  if ((hal_h264e_debug & 2) == 0) {
    uVar33 = auVar51._8_4_;
    uVar15 = auVar51._12_4_;
    uVar14 = auVar53._0_4_;
    uVar39 = auVar53._4_4_;
  }
  else {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_rdo_cfg");
    uVar33 = (uint)*(byte *)((long)__s + 0x673) << 0x18;
    uVar15 = (uint)*(byte *)((long)__s + 0x677) << 0x18;
    uVar14 = (uint)*(byte *)((long)__s + 0x67b) << 0x18;
    uVar39 = (uint)*(byte *)((long)__s + 0x67f) << 0x18;
  }
  bVar1 = (byte)h264_mode_bias[*(int *)(lVar2 + 0x2a4)];
  uVar26 = 0x18;
  if (0x18 < bVar1) {
    uVar26 = (uint)bVar1;
  }
  uVar28 = (uint)bVar1;
  uVar27 = 0x16;
  if (0x16 < uVar28) {
    uVar27 = uVar28;
  }
  uVar45 = 0x15;
  if (0x15 < uVar28) {
    uVar45 = uVar28;
  }
  *(uint *)((long)__s + 0x670) = uVar45 << 0x10 | uVar27 << 8 | uVar26 | uVar33;
  uVar26 = (uint)bVar1;
  uVar33 = 0x14;
  if (0x14 < uVar26) {
    uVar33 = uVar26;
  }
  *(uint *)((long)__s + 0x674) = uVar33 << 0x10 | uVar27 | uVar45 << 8 | uVar15;
  uVar15 = 0x13;
  if (0x13 < uVar26) {
    uVar15 = uVar26;
  }
  uVar27 = 0x12;
  if (0x12 < uVar26) {
    uVar27 = uVar26;
  }
  *(uint *)((long)__s + 0x678) = uVar27 << 0x10 | uVar33 | uVar15 << 8 | uVar14;
  *(uint *)((long)__s + 0x67c) = uVar26 << 0x10 | uVar26 | (uint)bVar1 << 8 | uVar39;
  if (*(int *)(lVar2 + 0x2c0) != 0) {
    uVar15 = *(uint *)(lVar2 + 0x2c8);
    uVar14 = uVar15 & 0xff;
    uVar39 = 10;
    if ((int)*(uint *)(lVar2 + 0x2c4) < 10) {
      uVar39 = *(uint *)(lVar2 + 0x2c4) & 0xfff;
    }
    uVar33 = *(uint *)((long)__s + 0x6a8);
    *(uint *)((long)__s + 0x6a8) = uVar33 & 0xfffff000 | uVar39;
    uVar26 = 0x80000;
    if ((int)*(uint *)(lVar2 + 0x2c4) < 8) {
      uVar26 = (*(uint *)(lVar2 + 0x2c4) & 0xfff) << 0x10;
    }
    *(uint *)((long)__s + 0x6a8) = uVar33 & 0xf000f000 | uVar39 | uVar26;
    uVar39 = 0xf;
    if ((int)*(uint *)(lVar2 + 0x2c4) < 0xf) {
      uVar39 = *(uint *)(lVar2 + 0x2c4) & 0xfff;
    }
    uVar33 = *(uint *)((long)__s + 0x6ac);
    *(uint *)((long)__s + 0x6ac) = uVar33 & 0xfffff000 | uVar39;
    uVar26 = 0x14;
    if (0x14 < uVar14) {
      uVar26 = uVar14;
    }
    *(uint *)((long)__s + 0x6ac) =
         uVar33 & 0xf000f000 | uVar39 | (*(uint *)(lVar2 + 0x2c4) & 0xfff) << 0x10;
    uVar39 = uVar14 << 8;
    uVar33 = uVar14 << 0x10;
    *(uint *)((long)__s + 0x6c0) = uVar15 << 0x18 | uVar26 | uVar39 | uVar33;
    *(uint *)((long)__s + 0x6c4) =
         (uint)*(byte *)((long)__s + 0x6c7) << 0x18 | uVar39 | uVar33 | uVar14;
    *(uint *)((long)__s + 0x6c8) =
         (uint)*(byte *)((long)__s + 0x6cb) << 0x18 | uVar39 | uVar33 | uVar14;
    *(uint *)((long)__s + 0x6cc) =
         (uint)*(byte *)((long)__s + 0x6cf) << 0x18 | uVar39 | uVar33 | uVar14;
  }
  memcpy((void *)((long)__s + 0x774),vepu580_540_h264_flat_scl_tab,0x900);
  lVar36 = *(long *)((long)hal + 0x1e8);
  lVar30 = *hal;
  iVar29 = *(int *)(*(long *)((long)hal + 0x60) + 0x3c);
  uVar15 = (pEVar4->info).bit_target;
  uVar39 = (pEVar4->info).quality_target;
  uVar14 = (pEVar4->info).quality_min;
  uVar33 = (pEVar4->info).quality_max;
  local_50 = (ushort *)
             CONCAT44(local_50._4_4_,
                      (int)(uVar15 << 4) / (*(int *)(*(long *)((long)hal + 0x60) + 0x40) * iVar29));
  if ((hal_h264e_debug >> 8 & 1) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","bittarget %d qp [%d %d %d]\n","setup_vepu580_rc_base",
               (ulong)uVar15,(ulong)uVar14,uVar39,uVar33);
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_rc_base");
  }
  uVar14 = uVar14 & 0x3f;
  uVar33 = uVar33 & 0x3f;
  *(uint *)((long)__s + 0x208) =
       *(uint *)((long)__s + 0x208) & 0xc0000000 | uVar14 | uVar14 << 0xc | uVar14 << 0x18 |
       uVar33 << 6 | uVar33 << 0x12;
  *(uint *)((long)__s + 0x20c) =
       uVar33 << 0x18 |
       uVar14 << 0x12 | uVar33 << 0xc | uVar14 << 6 | *(uint *)((long)__s + 0x20c) & 0xc0000000 |
       uVar33;
  *(uint *)((long)__s + 0x210) =
       *(uint *)((long)__s + 0x210) & 0xc0000000 | uVar14 | uVar14 << 0xc | uVar14 << 0x18 |
       uVar33 << 6 | uVar33 << 0x12;
  *(uint *)((long)__s + 0x214) = (*(uint *)((long)__s + 0x214) & 0x3fffffc0) + uVar33 + 0x40000000;
  if (*(int *)(lVar30 + 0x94) == 2) {
    *(uint *)((long)__s + 0xe0) = *(uint *)((long)__s + 0xe0) & 0xffffc0ff | (uVar39 & 0x3f) << 8;
    *(uint *)((long)__s + 0x134) =
         uVar39 << 0x1a | *(uint *)((long)__s + 0x134) & 0xfffff | (uVar39 & 0x3f) << 0x14;
  }
  else {
    uVar15 = 0x50000;
    if ((int)(uint)local_50 < 0x100000) {
      uVar15 = (uint)local_50;
    }
    iVar38 = (int)(uVar15 * iVar29) >> 4;
    iVar18 = iVar38 * 5;
    iVar38 = iVar38 * 5 + 0xf;
    if (-1 < iVar18) {
      iVar38 = iVar18;
    }
    iVar38 = iVar38 >> 4;
    *(uint *)((long)__s + 0xe0) = *(uint *)((long)__s + 0xe0) & 0xffffc0ff | (uVar39 & 0x3f) << 8;
    *(uint *)((long)__s + 0x130) = (*(uint *)((long)__s + 0x130) & 0xff8) + iVar29 * 0x1000 + 3;
    uVar12 = *(ushort *)((long)__s + 0x134);
    *(uint *)((long)__s + 0x134) =
         uVar14 << 0x1a |
         uVar33 << 0x14 |
         (*(uint *)(lVar30 + 0x17c + (ulong)(*(int *)(lVar36 + 0x2c) == 2) * 4) & 0xf) << 0x10 |
         (uint)uVar12;
    *(uint *)((long)__s + 0x138) = *(uint *)((long)__s + 0x138) & 0xfff00000 | uVar15 & 0xfffff;
    *(ulong *)((long)__s + 0x1d8) =
         *(ulong *)((long)__s + 0x1d8) & 0xfff00000fe000000 | (ulong)DAT_002ad4e0;
    *(int *)((long)__s + 0x1e0) = iVar38 * -4;
    *(int *)((long)__s + 0x1e4) = -iVar38;
    *(int *)((long)__s + 0x1e8) = iVar38;
    *(int *)((long)__s + 0x1ec) = iVar38 << 2;
    *(undefined8 *)((long)__s + 0x1f0) = 0x7fffffff7fffffff;
    *(undefined8 *)((long)__s + 0x1f8) = 0x7fffffff7fffffff;
    *(undefined4 *)((long)__s + 0x200) = 0x7fffffff;
    *(ulong *)((long)__s + 0x248) =
         *(ulong *)((long)__s + 0x248) & DAT_002ad460 | (ulong)DAT_002ad4f0;
    if (*(int *)(lVar30 + 0x94) == 4) {
      *(uint *)((long)__s + 0x134) = uVar14 << 0x1a | uVar33 << 0x14 | (uint)uVar12;
    }
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_rc_base");
    }
  }
  pHVar42 = local_48;
  cfgs = *(MppDevRegOffCfgs **)((long)hal + 0x38);
  s = local_48->packet;
  frame = local_48->frame;
  pvVar20 = mpp_frame_get_buffer(frame);
  pvVar43 = pHVar42->output;
  local_34 = mpp_frame_get_fmt(frame);
  RVar16 = mpp_frame_get_hor_stride(frame);
  RVar34 = mpp_frame_get_ver_stride(frame);
  local_58 = CONCAT44(extraout_var,RVar34);
  iVar29 = mpp_buffer_get_fd_with_caller(pvVar20,"setup_vepu580_io_buf");
  sVar21 = mpp_packet_get_length(s);
  local_50 = (ushort *)mpp_buffer_get_size_with_caller(pvVar43,"setup_vepu580_io_buf");
  iVar18 = mpp_buffer_get_fd_with_caller(pvVar43,"setup_vepu580_io_buf");
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_io_buf");
  }
  *(int *)((long)__s + 0x60) = iVar29;
  *(int *)((long)__s + 100) = iVar29;
  *(int *)((long)__s + 0x68) = iVar29;
  *(int *)((long)__s + 0x90) = iVar18;
  *(int *)((long)__s + 0x94) = iVar18;
  *(int *)((long)__s + 0x98) = iVar18;
  *(int *)((long)__s + 0x9c) = iVar18;
  if ((local_34 & 0xf00000) != MPP_FMT_YUV420SP) {
    offset = mpp_frame_get_fbc_offset(frame);
    RVar34 = 0;
    goto switchD_00220f1b_caseD_8;
  }
  RVar34 = 0;
  offset = 0;
  if (MPP_FMT_AYUV1BPP < (local_34 & 0xfffc) || (local_34 & 0xf0000) != MPP_FMT_YUV420SP)
  goto switchD_00220f1b_caseD_8;
  vepu541_set_fmt(&local_80,local_34);
  RVar34 = 0;
  offset = 0;
  iVar29 = (int)local_58;
  switch(local_80.format) {
  case VEPU541_FMT_YUV422SP:
  case VEPU541_FMT_YUV420SP:
  case VEPU580_FMT_YUV444SP:
    RVar34 = iVar29 * RVar16;
    goto LAB_00220f3a;
  case VEPU541_FMT_YUV422P:
    RVar34 = (int)(iVar29 * RVar16 * 3) / 2;
    goto LAB_00220f79;
  case VEPU541_FMT_YUV420P:
    iVar18 = iVar29 * RVar16 * 5;
    iVar38 = iVar29 * RVar16 * 5 + 3;
    if (-1 < iVar18) {
      iVar38 = iVar18;
    }
    RVar34 = iVar38 >> 2;
LAB_00220f79:
    offset = iVar29 * RVar16;
    break;
  case VEPU541_FMT_YUYV422:
  case VEPU541_FMT_UYVY422:
  case VEPU540_FMT_YUV400:
  case VEPU540_FMT_BUTT:
    break;
  case VEPU580_FMT_YUV444P:
    RVar34 = iVar29 * RVar16 * 2;
LAB_00220f3a:
    offset = iVar29 * RVar16;
    break;
  default:
    offset = 0;
  }
switchD_00220f1b_caseD_8:
  mpp_dev_multi_offset_update(cfgs,0xa1,offset);
  mpp_dev_multi_offset_update(cfgs,0xa2,RVar34);
  mpp_dev_multi_offset_update(cfgs,0xac,(RK_U32)local_50);
  mpp_dev_multi_offset_update(cfgs,0xaf,(RK_U32)sVar21);
  if (((hal_h264e_debug & 2) != 0) &&
     (_mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_io_buf"), (hal_h264e_debug & 2) != 0
     )) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_roi");
  }
  puVar5 = *(undefined8 **)((long)hal + 0x118);
  if (puVar5 != (undefined8 *)0x0) {
    uVar15 = ((int)((ulong)*(undefined8 *)(*hal + 0xc) >> 0x20) + 0x3f >> 4 & 0xfffffffcU) *
             ((int)*(undefined8 *)(*hal + 0xc) + 0x3f >> 4 & 0xfffffffcU);
    sVar21 = mpp_buffer_get_size_with_caller((MppBuffer)*puVar5,"setup_vepu580_roi");
    if (sVar21 < uVar15 * 8) {
      _mpp_log_l(2,"hal_h264e_vepu580","roi base cfg buf not enough, roi is invalid",(char *)0x0);
    }
    else {
      *(byte *)((long)__s + 0xe0) = *(byte *)((long)__s + 0xe0) | 2;
      iVar29 = mpp_buffer_get_fd_with_caller((MppBuffer)*puVar5,"setup_vepu580_roi");
      *(int *)((long)__s + 0xa8) = iVar29;
    }
    if ((*(byte *)(puVar5 + 4) & 1) != 0) {
      sVar21 = mpp_buffer_get_size_with_caller((MppBuffer)puVar5[1],"setup_vepu580_roi");
      if (sVar21 < uVar15 * 2) {
        _mpp_log_l(2,"hal_h264e_vepu580","roi qp cfg buf not enough, roi is invalid",(char *)0x0);
      }
      else {
        iVar29 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar5[1],"setup_vepu580_roi");
        *(int *)((long)__s + 0xac) = iVar29;
        *(byte *)((long)__s + 0x170) = *(byte *)((long)__s + 0x170) | 1;
      }
    }
    if ((*(byte *)(puVar5 + 4) & 2) != 0) {
      sVar21 = mpp_buffer_get_size_with_caller((MppBuffer)puVar5[2],"setup_vepu580_roi");
      if (sVar21 < uVar15 >> 2) {
        _mpp_log_l(2,"hal_h264e_vepu580","roi amv cfg buf not enough, roi is invalid",(char *)0x0);
      }
      else {
        iVar29 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar5[2],"setup_vepu580_roi");
        *(int *)((long)__s + 0xb0) = iVar29;
        *(byte *)((long)__s + 0x170) = *(byte *)((long)__s + 0x170) | 2;
      }
    }
    if ((*(byte *)(puVar5 + 4) & 4) != 0) {
      sVar21 = mpp_buffer_get_size_with_caller((MppBuffer)puVar5[3],"setup_vepu580_roi");
      if (sVar21 < uVar15 * 0x60 >> 2) {
        _mpp_log_l(2,"hal_h264e_vepu580","roi mv cfg buf not enough, roi is invalid",(char *)0x0);
      }
      else {
        iVar29 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar5[3],"setup_vepu580_roi");
        *(int *)((long)__s + 0xb4) = iVar29;
        *(byte *)((long)__s + 0x170) = *(byte *)((long)__s + 0x170) | 4;
      }
    }
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_roi");
  }
  lVar36 = *(long *)((long)hal + 0x78);
  bufs = *(HalBufs *)((long)hal + 0x18);
  RVar16 = *(RK_U32 *)((long)hal + 0x20);
  pHVar22 = hal_bufs_get_buf(bufs,*(RK_S32 *)(lVar36 + 4));
  pHVar23 = hal_bufs_get_buf(bufs,*(RK_S32 *)(lVar36 + 8));
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_recn_refr");
  }
  if ((pHVar22 != (HalBuf *)0x0) && (pHVar22->cnt != 0)) {
    pvVar43 = *pHVar22->buf;
    pvVar20 = pHVar22->buf[1];
    iVar29 = mpp_buffer_get_fd_with_caller(pvVar43,"setup_vepu580_recn_refr");
    if (((pvVar43 == (MppBuffer)0x0) &&
        (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_pixel",
                    "setup_vepu580_recn_refr",0x66c), (mpp_debug._3_1_ & 0x10) != 0)) ||
       ((pvVar20 == (MppBuffer)0x0 &&
        (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_thumb",
                    "setup_vepu580_recn_refr",0x66d), (mpp_debug._3_1_ & 0x10) != 0))))
    goto LAB_00222b98;
    *(int *)((long)__s + 0x6c) = iVar29;
    *(int *)((long)__s + 0x70) = iVar29;
    iVar29 = mpp_buffer_get_fd_with_caller(pvVar20,"setup_vepu580_recn_refr");
    *(int *)((long)__s + 0x84) = iVar29;
  }
  if ((pHVar23 != (HalBuf *)0x0) && (pHVar23->cnt != 0)) {
    pvVar43 = *pHVar23->buf;
    pvVar20 = pHVar23->buf[1];
    iVar29 = mpp_buffer_get_fd_with_caller(pvVar43,"setup_vepu580_recn_refr");
    if (((pvVar43 == (MppBuffer)0x0) &&
        (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_pixel",
                    "setup_vepu580_recn_refr",0x679), (mpp_debug._3_1_ & 0x10) != 0)) ||
       ((pvVar20 == (MppBuffer)0x0 &&
        (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_thumb",
                    "setup_vepu580_recn_refr",0x67a), (mpp_debug._3_1_ & 0x10) != 0))))
    goto LAB_00222b98;
    *(int *)((long)__s + 0x74) = iVar29;
    *(int *)((long)__s + 0x78) = iVar29;
    iVar29 = mpp_buffer_get_fd_with_caller(pvVar20,"setup_vepu580_recn_refr");
    *(int *)((long)__s + 0x88) = iVar29;
  }
  mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x38),0xa4,RVar16);
  mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x38),0xa6,RVar16);
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_recn_refr");
  }
  lVar36 = local_40;
  pHVar42 = local_48;
  if (local_48->md_info == (MppBuffer)0x0) {
    uVar15 = 0;
    iVar29 = 0;
  }
  else {
    iVar29 = mpp_buffer_get_fd_with_caller(local_48->md_info,"hal_h264e_vepu580_gen_regs");
    uVar15 = (uint)(pHVar42->md_info != (MppBuffer)0x0) << 3;
  }
  *(int *)((long)__s + 0x8c) = iVar29;
  *(uint *)((long)__s + 0xe0) = *(uint *)((long)__s + 0xe0) & 0xfffffff7 | uVar15;
  RVar16 = mpp_frame_get_offset_y(pHVar42->frame);
  *(uint *)((long)__s + 0x110) =
       *(uint *)((long)__s + 0x110) & 0xc000ffff | (RVar16 & 0x3fff) << 0x10;
  RVar16 = mpp_frame_get_offset_x(pHVar42->frame);
  *(uint *)((long)__s + 0x110) = *(uint *)((long)__s + 0x110) & 0xffffc000 | RVar16 & 0x3fff;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_split");
  }
  iVar29 = *(int *)(lVar2 + 0xe94);
  if (iVar29 == 2) {
    iVar29 = *(int *)(lVar2 + 0xc);
    iVar18 = *(int *)(lVar2 + 0x10);
    uVar15 = *(uint *)(lVar2 + 0xe98);
    *(uint *)((long)__s + 0x140) = *(uint *)((long)__s + 0x140) & 0x80007ff8 | 0x1f48003;
    *(uint *)((long)__s + 0x148) =
         *(uint *)((long)__s + 0x148) & 0xfff00000 | *(int *)(lVar2 + 0xe98) - 1U & 0xfffff;
    *(uint *)((long)__s + 0x144) = *(uint *)((long)__s + 0x144) & 0xfff00000;
    iVar38 = *(int *)(lVar2 + 0xe9c);
    *(uint *)((long)__s + 0xe0) =
         *(uint *)((long)__s + 0xe0) & 0xbfffffff | (uint)(iVar38 != 0) << 0x1e;
    if (((*(byte *)(lVar2 + 0xe9c) & 1) != 0) ||
       ((iVar38 != 0 && (0x20 < (((iVar18 + 0xf >> 4) * (iVar29 + 0xf >> 4) + uVar15) - 1) / uVar15)
        ))) {
      *(byte *)((long)__s + 0x20) = *(byte *)((long)__s + 0x20) | 8;
    }
  }
  else if (iVar29 == 1) {
    *(uint *)((long)__s + 0x140) = *(uint *)((long)__s + 0x140) & 0x80007ff8 | 0x1f48001;
    *(uint *)((long)__s + 0x148) = *(uint *)((long)__s + 0x148) & 0xfff00000;
    *(uint *)((long)__s + 0x144) =
         *(uint *)((long)__s + 0x144) & 0xfff00000 | *(uint *)(lVar2 + 0xe98) & 0xfffff;
    uVar15 = (uint)(*(int *)(lVar2 + 0xe9c) != 0) << 0x1e;
    *(uint *)((long)__s + 0xe0) = *(uint *)((long)__s + 0xe0) & 0xbfffffff | uVar15;
    *(uint *)((long)__s + 0x20) = *(uint *)((long)__s + 0x20) & 0xfffffff7 | uVar15 >> 0x1b;
  }
  else if (iVar29 == 0) {
    *(uint *)((long)__s + 0x148) = *(uint *)((long)__s + 0x148) & 0xfff00000;
    *(ulong *)((long)__s + 0x140) = *(ulong *)((long)__s + 0x140) & 0xfff0000080007ff8;
    *(byte *)((long)__s + 0xe3) = *(byte *)((long)__s + 0xe3) & 0xbf;
  }
  else {
    _mpp_log_l(4,"hal_h264e_vepu580","invalide slice split mode %d\n","setup_vepu580_split");
  }
  *(undefined4 *)(lVar2 + 0xe90) = 0;
  if ((hal_h264e_debug & 2) == 0) {
    iVar29 = piVar3[7];
  }
  else {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_split");
    iVar29 = piVar3[7];
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_me");
    }
  }
  uVar15 = 0xc;
  if (iVar29 < 0x14) {
    if ((iVar29 - 0xbU < 3) || (iVar29 != 10)) {
LAB_0022173e:
      uVar15 = 0x1c;
    }
  }
  else if (iVar29 != 99) goto LAB_0022173e;
  uVar39 = piVar3[0xf] * 2 + 1;
  uVar14 = 0x2f0b;
  if ((int)uVar39 < 0x2c) {
    uVar14 = piVar3[0xf] * 2 + 4;
    if (-1 < (int)uVar39) {
      uVar14 = uVar39;
    }
    uVar14 = uVar14 >> 2 & 0xf | 0x2f00;
  }
  uVar33 = uVar15 >> 2;
  uVar26 = piVar3[0x10] * 0x10 + 0x3fU & 0xffffffc0;
  uVar39 = uVar26 + 0x7f;
  if (-1 < (int)uVar26) {
    uVar39 = uVar26;
  }
  iVar29 = (int)uVar39 >> 7;
  uVar39 = iVar29 << 4;
  if (uVar33 == iVar29 * 4 || SBORROW4(uVar33,iVar29 * 4) != (int)(uVar33 + iVar29 * -4) < 0) {
    uVar39 = uVar15;
  }
  uVar39 = uVar39 & 0x3c;
  *(uint *)((long)__s + 0x150) = uVar39 * 4 | *(uint *)((long)__s + 0x150) & 0xc000 | uVar14;
  uVar15 = (uint)*(ushort *)((long)__s + 0x156) * 0x10000;
  uVar33 = uVar15 + 0x505;
  if (*(int *)(lVar36 + 0x2c) == 2) {
    uVar33 = uVar15;
  }
  *(uint *)((long)__s + 0x154) = uVar33;
  iVar29 = 0x20000;
  if (piVar3[7] < 0x15) {
    iVar29 = (uint)(10 < piVar3[7]) << 0x10;
  }
  *(uint *)((long)__s + 0x154) = iVar29 + (uVar33 & 0x46300505) + 0x80000;
  uVar15 = *(uint *)((long)__s + 0x160);
  uVar26 = uVar14 & 0xf;
  uVar27 = (uVar15 & 0x1fff) + uVar26 * -4;
  uVar33 = uVar27 >> 4;
  if ((int)uVar27 < 0) {
    uVar33 = -(0xf - uVar27 >> 4);
  }
  uVar28 = (piVar3[0xf] * 0x10 + 0x3f >> 6) - 1;
  uVar27 = uVar28;
  if ((int)uVar33 < (int)uVar28) {
    uVar27 = uVar33;
  }
  if ((int)uVar33 < 0) {
    uVar27 = 0;
  }
  if ((int)(((uVar15 & 0x1fff) + uVar26 * 4 + 0xf >> 4) + uVar28) < 0) {
    uVar28 = 0;
  }
  uVar33 = (uVar28 - uVar27) * 0x40 + 0x40;
  uVar35 = 0x40000;
  if (uVar33 != 0) {
    uVar35 = (ulong)((uVar33 & 0x7fc0) << 0xc);
  }
  uVar14 = (uVar15 & 0xf) + (uVar14 & 3) * -4;
  uVar14 = (uVar14 >> 0x1b & 0xfffffff0) + uVar14 + uVar26 * 8 + 0xf >> 4;
  uVar15 = uVar15 >> 0x10 & 3;
  iVar29 = uVar15 + uVar39 * 2;
  uVar33 = uVar15 + uVar39 * 2 + 3 >> 2;
  uVar15 = (uint)(uVar35 >> 0x12);
  uVar39 = uVar14 + 1;
  if (uVar15 <= uVar14) {
    uVar39 = uVar15;
  }
  uVar14 = uVar33 + 1;
  iVar18 = (int)(uVar35 >> 0x10);
  if (iVar29 == 0) {
    iVar38 = 1;
  }
  else {
    iVar46 = uVar33 + (uVar33 == 0);
    iVar48 = -iVar18;
    iVar41 = 1;
    do {
      iVar48 = iVar48 + iVar18;
      iVar38 = iVar41;
      if (0x99f < uVar39 * 4 * uVar14 + iVar48) break;
      bVar49 = uVar14 < 3;
      uVar14 = uVar14 - 1;
      if (bVar49) {
        uVar14 = 1;
      }
      bVar49 = iVar41 != iVar46;
      iVar38 = iVar46 + 1;
      iVar41 = iVar41 + 1;
    } while (bVar49);
  }
  iVar41 = uVar14 << 2;
  bVar49 = iVar29 == 0;
  uVar14 = iVar38 + -1 + (uint)bVar49;
  if (bVar49) {
    iVar41 = 0;
  }
  uVar33 = iVar38 + (uint)bVar49;
  if (0x9a0 < iVar41 * uVar39 + iVar18 * uVar14) {
    uVar33 = uVar14;
  }
  *(uint *)((long)__s + 0x158) =
       (uVar33 - 1) * uVar15 + uVar39 & 0x7ff |
       (uVar33 & 0x1f) << 0xb | *(uint *)((long)__s + 0x158) & 0xf8030000 | (uint)uVar35;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_me");
  }
  if (((pEVar4->frm).val >> 0x26 & 1) != 0) {
    lVar30 = (long)((pEVar4->frm).val >> 0x30) % (long)*(int *)(lVar2 + 0xc4);
    iVar38 = (int)lVar30;
    lVar36 = *hal;
    iVar29 = *(int *)(*(long *)((long)hal + 0x60) + 0x3c);
    uVar15 = *(uint *)(*(long *)((long)hal + 0x60) + 0x40);
    pHVar42 = (HalEncTask *)(ulong)uVar15;
    iVar18 = *(int *)(lVar36 + 0x16c);
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_intra_refresh");
      lVar36 = *hal;
    }
    if (*(int *)(lVar36 + 0x164) == 0) {
      uVar35 = 0xfffffffa;
    }
    else {
      uVar15 = (uVar15 + 3 & 0x3ffffffc) * (iVar29 + 3U & 0xfffffffc);
      iVar41 = uVar15 * 8;
      local_48 = pHVar42;
      if (SBORROW4(*(int *)((long)hal + 0x130),iVar41) !=
          (int)(*(int *)((long)hal + 0x130) + uVar15 * -8) < 0) {
        if (*(long *)((long)hal + 0x120) == 0) {
          mpp_buffer_group_get
                    ((MppBufferGroup *)((long)hal + 0x120),MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,
                     "hal_h264e_vepu580","setup_vepu580_intra_refresh");
        }
        if (*(MppBuffer *)((long)hal + 0x128) != (MppBuffer)0x0) {
          mpp_buffer_put_with_caller
                    (*(MppBuffer *)((long)hal + 0x128),"setup_vepu580_intra_refresh");
        }
        mpp_buffer_get_with_tag
                  (*(MppBufferGroup *)((long)hal + 0x120),(MppBuffer *)((long)hal + 0x128),
                   (long)iVar41,"hal_h264e_vepu580","setup_vepu580_intra_refresh");
        *(int *)((long)hal + 0x130) = iVar41;
      }
      pvVar43 = *(MppBuffer *)((long)hal + 0x128);
      if (pvVar43 == (MppBuffer)0x0) {
        _mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "ctx->roi_base_cfg_buf","setup_vepu580_intra_refresh",0x5ea);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00222b98;
        pvVar43 = *(MppBuffer *)((long)hal + 0x128);
      }
      iVar41 = mpp_buffer_get_fd_with_caller(pvVar43,"setup_vepu580_intra_refresh");
      pvVar24 = mpp_buffer_get_ptr_with_caller
                          (*(MppBuffer *)((long)hal + 0x128),"setup_vepu580_intra_refresh");
      if (uVar15 != 0) {
        uVar35 = 0;
        do {
          puVar5 = (undefined8 *)((long)pvVar24 + uVar35 * 8);
          *puVar5 = 0x4000000000000000;
          puVar5[1] = 0x4000000000000000;
          uVar35 = uVar35 + 2;
        } while (uVar15 != uVar35);
      }
      puVar25 = (ushort *)mpp_osal_calloc("setup_vepu580_intra_refresh",0x10);
      uVar15 = 0;
      if (puVar25 == (ushort *)0x0) {
        _mpp_log_l(2,"hal_h264e_vepu580","Failed to calloc for MppEncROIRegion !\n",
                   "setup_vepu580_intra_refresh");
        uVar15 = 0xfffffffc;
      }
      iVar29 = iVar29 << 4;
      iVar46 = (int)local_48 << 4;
      lVar36 = *hal;
      sVar9 = (short)iVar18;
      sVar47 = (short)lVar30;
      if (*(int *)(lVar36 + 0x168) == 1) {
        puVar25[1] = 0;
        puVar25[3] = (ushort)iVar46;
        if (iVar38 == 0) {
          sVar47 = (short)(iVar18 << 4);
          uVar12 = 0;
        }
        else {
          uVar12 = sVar47 * sVar9 * 0x10 - 0x20;
          sVar47 = sVar9 * 0x10 + 0x20;
        }
        *puVar25 = uVar12;
        uVar39 = 1;
        uVar14 = 0xfffffff0;
        lVar36 = 4;
LAB_00221cce:
        *(short *)((long)puVar25 + lVar36) = sVar47;
        *(uint *)((long)__s + 0x150) = uVar14 & *(uint *)((long)__s + 0x150) | uVar39;
        lVar36 = *hal;
      }
      else if (*(int *)(lVar36 + 0x168) == 0) {
        *puVar25 = 0;
        puVar25[2] = (ushort)iVar29;
        if (iVar38 == 0) {
          sVar47 = (short)(iVar18 << 4);
          uVar12 = 0;
        }
        else {
          uVar12 = sVar47 * sVar9 * 0x10 - 0x20;
          sVar47 = sVar9 * 0x10 + 0x20;
        }
        puVar25[1] = uVar12;
        uVar39 = 0x10;
        uVar14 = 0xffffff0f;
        lVar36 = 6;
        goto LAB_00221cce;
      }
      puVar25[4] = 1;
      puVar25[5] = -*(short *)(lVar36 + 0x124);
      puVar25[6] = 1;
      puVar25[7] = 1;
      *(byte *)((long)__s + 0xe0) = *(byte *)((long)__s + 0xe0) | 2;
      *(int *)((long)__s + 0xa8) = iVar41;
      local_50 = puVar25;
      if (pvVar24 == (void *)0x0 || puVar25 == (ushort *)0x0) {
        _mpp_log_l(2,"hal_h264e_vepu580","invalid buf %p roi %p\n","vepu580_h264_set_one_roi",
                   pvVar24,puVar25);
      }
      else {
        iVar29 = iVar29 >> 4;
        iVar46 = iVar46 >> 4;
        uVar39 = (uint)(*puVar25 >> 4);
        uVar14 = (uint)(puVar25[1] >> 4);
        iVar38 = (puVar25[2] + 0xf >> 4) + uVar39;
        iVar18 = (puVar25[3] + 0xf >> 4) + uVar14;
        if (iVar29 <= iVar38) {
          iVar38 = iVar29;
        }
        if (iVar46 <= iVar18) {
          iVar18 = iVar46;
        }
        if (*puVar25 < 0x10) {
          uVar39 = 0;
        }
        if (puVar25[1] < 0x10) {
          uVar14 = 0;
        }
        if (((iVar38 <= (int)uVar39) &&
            (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,
                        "pos_x_end > pos_x_init","vepu580_h264_set_one_roi",0x5b7),
            (mpp_debug._3_1_ & 0x10) != 0)) ||
           ((iVar18 <= (int)uVar14 &&
            (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,
                        "pos_y_end > pos_y_init","vepu580_h264_set_one_roi",0x5b8),
            (mpp_debug._3_1_ & 0x10) != 0)))) {
LAB_00222b98:
          abort();
        }
        auVar53 = _DAT_00277a10;
        auVar51 = _DAT_00277a00;
        if ((int)uVar14 < iVar18) {
          uVar33 = iVar29 + 3U & 0xfffffffc;
          pvVar24 = (void *)((long)pvVar24 + (long)(int)(uVar14 * uVar33 + uVar39) * 8);
          uVar26 = ~uVar39 + iVar38;
          auVar52._4_4_ = 0;
          auVar52._0_4_ = uVar26;
          auVar52._8_4_ = uVar26;
          auVar52._12_4_ = 0;
          iVar29 = 0;
          auVar52 = auVar52 ^ _DAT_00277a10;
          do {
            if ((int)uVar39 < iVar38) {
              uVar35 = 0;
              do {
                auVar54._8_4_ = (int)uVar35;
                auVar54._0_8_ = uVar35;
                auVar54._12_4_ = (int)(uVar35 >> 0x20);
                auVar54 = (auVar54 | auVar51) ^ auVar53;
                if ((bool)(~(auVar52._4_4_ < auVar54._4_4_ ||
                            auVar52._0_4_ < auVar54._0_4_ && auVar54._4_4_ == auVar52._4_4_) & 1)) {
                  *(undefined8 *)((long)pvVar24 + uVar35 * 8) = 0x2000000000000000;
                }
                if (auVar54._12_4_ <= auVar52._12_4_ &&
                    (auVar54._8_4_ <= auVar52._8_4_ || auVar54._12_4_ != auVar52._12_4_)) {
                  *(undefined8 *)((long)pvVar24 + uVar35 * 8 + 8) = 0x2000000000000000;
                }
                uVar35 = uVar35 + 2;
              } while (((ulong)uVar26 + 2 & 0xfffffffffffffffe) != uVar35);
            }
            iVar29 = iVar29 + 1;
            pvVar24 = (void *)((long)pvVar24 + (long)(int)uVar33 * 8);
          } while (iVar29 != iVar18 - uVar14);
        }
      }
      mpp_osal_free("setup_vepu580_intra_refresh",local_50);
      mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x128),0,"setup_vepu580_intra_refresh");
      uVar35 = (ulong)uVar15;
    }
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","leave, ret %d\n","setup_vepu580_intra_refresh",uVar35);
    }
  }
  if ((((*(int *)(lVar2 + 0x1868) == 0) || ((pEVar4->info).complex_scene != 0)) ||
      (*(int *)(lVar2 + 0x94) != 4)) || (*(int *)(lVar2 + 0x1864) != 1)) goto LAB_00222199;
  lVar36 = *hal;
  iVar29 = (*(int *)(lVar36 + 0x10) + 0xf >> 4) * (*(int *)(lVar36 + 0xc) + 0x3f >> 4 & 0xfffffffcU)
  ;
  *(int *)((long)hal + 0x188) = iVar29 * 8;
  *(int *)((long)hal + 0x18c) = iVar29 * 2;
  *(int *)((long)hal + 400) = iVar29;
  if (*(int *)(lVar36 + 0x1868) == 0) {
    uVar15 = 0;
    _mpp_log_l(4,"hal_h264e_vepu580","deblurring is closed!\n",(char *)0x0);
    bVar49 = true;
  }
  else {
    if ((*(long *)((long)hal + 0x170) == 0) &&
       (mpp_buffer_get_with_tag
                  ((MppBufferGroup)0x0,(MppBuffer *)((long)hal + 0x170),(long)(iVar29 * 8),
                   "hal_h264e_vepu580","setup_vepu580_qpmap_buf"),
       *(MppBuffer *)((long)hal + 0x170) == (MppBuffer)0x0)) {
      fmt = "qpmap_base_cfg_buf malloc fail, qpmap invalid\n";
    }
    else {
      if ((*(long *)((long)hal + 0x178) != 0) ||
         (mpp_buffer_get_with_tag
                    ((MppBufferGroup)0x0,(MppBuffer *)((long)hal + 0x178),(long)(iVar29 * 2),
                     "hal_h264e_vepu580","setup_vepu580_qpmap_buf"),
         *(MppBuffer *)((long)hal + 0x178) != (MppBuffer)0x0)) {
        uVar15 = 0;
        bVar49 = true;
        if (*(long *)((long)hal + 0x180) == 0) {
          pvVar24 = mpp_osal_malloc("setup_vepu580_qpmap_buf",(long)iVar29);
          *(void **)((long)hal + 0x180) = pvVar24;
          uVar15 = 0;
          bVar49 = true;
          if (pvVar24 == (void *)0x0) {
            bVar49 = false;
            _mpp_log_l(2,"hal_h264e_vepu580","md_flag_buf malloc fail, qpmap invalid\n",(char *)0x0)
            ;
            uVar15 = 0xfffffffa;
          }
        }
        goto LAB_00222141;
      }
      fmt = "qpmap_qp_cfg_buf malloc fail, qpmap invalid\n";
    }
    bVar49 = false;
    _mpp_log_l(2,"hal_h264e_vepu580",fmt,(char *)0x0);
    uVar15 = 0xfffffffa;
  }
LAB_00222141:
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave, ret %d\n","setup_vepu580_qpmap_buf",(ulong)uVar15);
  }
  if (!bVar49) {
    _mpp_log_l(2,"hal_h264e_vepu580","qpmap malloc buffer failed!\n",(char *)0x0);
  }
LAB_00222199:
  vepu580_set_osd((Vepu541OsdCfg *)((long)hal + 0x138));
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter\n","setup_vepu580_l2");
  }
  memcpy((void *)((long)__s + 0x4bc),h264e_lambda_default + 6,0xd0);
  memset((void *)((long)__s + 0x3bc),0,0xd0);
  *(uint *)((long)__s + 0x218) = *(uint *)((long)__s + 0x218) & 0xff00fffe | 0x190000;
  *(uint *)((long)__s + 700) = *(uint *)((long)__s + 700) & 0xf000f000 | 0x40001;
  *(uint *)((long)__s + 0x2c0) = *(uint *)((long)__s + 0x2c0) & 0xf000f000 | 0x240009;
  *(uint *)((long)__s + 0x2c4) = *(uint *)((long)__s + 0x2c4) & 0xf000f000 | 0x40001;
  *(uint *)((long)__s + 0x2c8) = *(uint *)((long)__s + 0x2c8) & 0xf000f000 | 0x240009;
  *(ulong *)((long)__s + 0x2cc) =
       *(ulong *)((long)__s + 0x2cc) & 0xf000f000f000f000 | (ulong)DAT_002ad530;
  *(uint *)((long)__s + 0x2d4) = *(uint *)((long)__s + 0x2d4) & 0xfffff000;
  *(undefined8 *)((long)__s + 0x2d8) = 0x30283c3030283c30;
  *(undefined8 *)((long)__s + 0x2e0) = 0x201c2a2430283c30;
  uVar15 = *(uint *)((long)__s + 0x2ec);
  *(uint *)((long)__s + 0x2ec) = uVar15 & 0xfff003ff | 0x2ac00;
  bVar49 = *(int *)(local_40 + 0x2c) == 2;
  uVar39 = 0x247;
  if (bVar49) {
    uVar39 = 0x2ab;
  }
  *(uint *)((long)__s + 0x2ec) = uVar15 & 0xfff00000 | 0x2ac00 | uVar39;
  uVar15 = (uint)bVar49;
  uVar35 = CONCAT44((int)(uVar15 << 0x1f) >> 0x1f,(int)(uVar15 << 0x1f) >> 0x1f);
  *(ulong *)((long)__s + 0x2fc) =
       uVar35 & (ulong)DAT_002ad560 | ~uVar35 & 0x2d005100100004 |
       *(ulong *)((long)__s + 0x2fc) & (ulong)DAT_002ad540;
  bVar49 = *(int *)(local_40 + 0x2c) == 2;
  uVar15 = 0x101419;
  if (bVar49) {
    uVar15 = 0x101214;
  }
  uVar39 = (uint)bVar49;
  uVar35 = CONCAT44((int)(uVar39 << 0x1f) >> 0x1f,(int)(uVar39 << 0x1f) >> 0x1f);
  *(ulong *)((long)__s + 0x30c) =
       *(ulong *)((long)__s + 0x30c) & DAT_002ad460 |
       uVar35 & (ulong)DAT_002ad580 | ~uVar35 & (ulong)DAT_002ad570;
  *(uint *)((long)__s + 0x314) = (uint)*(byte *)((long)__s + 0x317) << 0x18 | uVar15;
  *(uint *)((long)__s + 0x31c) = *(uint *)((long)__s + 0x31c) & 0xfffffcf8 | 0x306;
  *(uint *)((long)__s + 800) = *(uint *)((long)__s + 800) & 0xe0080200 | 0x8014020;
  *(uint *)((long)__s + 0x324) = *(uint *)((long)__s + 0x324) & 0xfc00fc00 | 0x80004;
  *(uint *)((long)__s + 0x328) = *(uint *)((long)__s + 0x328) & 0xfc00fc00 | 0x180018;
  *(ulong *)((long)__s + 0x32c) =
       *(ulong *)((long)__s + 0x32c) & 0xc0000000f0f0f000 | 0x800800408030032;
  *(ulong *)((long)__s + 0x334) =
       *(ulong *)((long)__s + 0x334) & 0xfff0fffffffff000 | 0x1000000000002;
  if (*(int *)(local_40 + 0x2c) == 2) {
    lVar36 = 0;
    do {
      *(undefined1 *)((long)__s + lVar36 + 0x21c) = *(undefined1 *)(lVar2 + 0x198 + lVar36 * 4);
      *(byte *)((long)__s + lVar36 + 0x22c) = *(byte *)(lVar2 + 0x218 + lVar36 * 4) & 0x3f;
      lVar36 = lVar36 + 1;
    } while (lVar36 != 0x10);
  }
  else {
    lVar36 = 0;
    do {
      *(undefined1 *)((long)__s + lVar36 + 0x21c) = *(undefined1 *)(lVar2 + 0x1d8 + lVar36 * 4);
      *(byte *)((long)__s + lVar36 + 0x22c) = *(byte *)(lVar2 + 600 + lVar36 * 4) & 0x3f;
      lVar36 = lVar36 + 1;
    } while (lVar36 != 0x10);
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave\n","setup_vepu580_l2");
  }
  if (*(MppBuffer *)((long)hal + 0x1f0) == (MppBuffer)0x0) {
    *(undefined4 *)((long)__s + 0xbc) = 0;
  }
  else {
    iVar29 = mpp_buffer_get_fd_with_caller
                       (*(MppBuffer *)((long)hal + 0x1f0),"setup_vepu580_ext_line_buf");
    RVar16 = *(RK_U32 *)((long)hal + 0x58);
    *(int *)((long)__s + 0xb8) = iVar29;
    *(int *)((long)__s + 0xbc) = iVar29;
    mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x38),0xb6,RVar16);
    if (disable_rcb_buf == 0) {
      local_80.alpha_swap = RVar16;
      local_80.format = 0xb7;
      mpp_dev_ioctl(*(MppDev *)((long)hal + 8),8,&local_80);
      local_80.format = 0xb6;
      local_80.alpha_swap = 0;
      mpp_dev_ioctl(*(MppDev *)((long)hal + 8),8,&local_80);
    }
  }
  plVar6 = *(long **)((long)hal + 0x168);
  if (plVar6 != (long *)0x0) {
    plVar7 = (long *)*plVar6;
    lVar2 = *plVar7;
    lVar36 = plVar7[0x3a];
    bVar49 = *(int *)(lVar2 + 0x1864) != 1;
    lVar30 = plVar7[0x3d];
    *(uint *)((long)plVar6 + 0xc) = (uint)bVar49;
    uVar15 = (int)plVar6[1] + (uint)bVar49 * 2;
    if (uVar15 < 4) {
      if (*(int *)(lVar30 + 0x2c) != 2) {
        if ((int)plVar6[1] == 0) {
          pRVar40 = h264e_klut_weight + 4;
          if (*(int *)(lVar2 + 0x94) == 4) {
            pRVar40 = h264e_klut_weight;
          }
        }
        else {
          pRVar40 = h264e_klut_weight;
        }
        pRVar44 = (RK_U32 *)(lVar36 + 0x25c);
        for (lVar31 = 0x18; lVar31 != 0; lVar31 = lVar31 + -1) {
          *pRVar44 = *pRVar40;
          pRVar40 = pRVar40 + (ulong)bVar50 * -2 + 1;
          pRVar44 = pRVar44 + (ulong)bVar50 * -2 + 1;
        }
      }
      *(ulong *)(lVar36 + 0x248) =
           *(ulong *)(lVar36 + 0x248) & 0xff000000ff000000 | (ulong)DAT_002ad4f0;
      if ((int)plVar6[1] != 0) {
        *(uint *)(lVar36 + 0x2d4) = *(uint *)(lVar36 + 0x2d4) & 0xfffff000 | 0x9c5;
        *(uint *)(lVar36 + 0x2ec) = *(uint *)(lVar36 + 0x2ec) & 0xfff003ff | 0x55400;
        *(byte *)(lVar36 + 600) = *(byte *)(lVar36 + 600) & 0xf8;
        *(ulong *)(lVar36 + 0x180) = *(ulong *)(lVar36 + 0x180) & 0xf000f000fff7ffff;
        *(byte *)(lVar36 + 0x58c) = *(byte *)(lVar36 + 0x58c) & 0xfe;
        *(uint *)(lVar36 + 0x300) = *(uint *)(lVar36 + 0x300) & 0xffc0ffff | 0x330000;
        *(byte *)(lVar36 + 0x31c) = *(byte *)(lVar36 + 0x31c) & 0xfb;
        *(uint *)(lVar36 + 0x32c) = *(uint *)(lVar36 + 0x32c) & 0xfffff000;
        *(uint *)(lVar36 + 0x334) = *(uint *)(lVar36 + 0x334) & 0xfffff000;
        *(uint *)(lVar36 + 0x338) = *(uint *)(lVar36 + 0x338) & 0xfff0ffff | 0x80000;
      }
      *(ulong *)(lVar36 + 0x658) =
           *(ulong *)(lVar36 + 0x658) & 0xfffff000f000f000 | (ulong)DAT_002ad5e0;
      *(ulong *)(lVar36 + 0x670) =
           CONCAT44(intra_atf_wgt[uVar15][5] << 0x10,intra_atf_wgt[uVar15][2] << 0x10) &
           (ulong)DAT_002ad610 |
           CONCAT44(intra_atf_wgt[uVar15][4] << 8,intra_atf_wgt[uVar15][1] << 8) &
           (ulong)DAT_002ad600 |
           *(ulong *)(lVar36 + 0x670) & 0xff000000ff000000 |
           CONCAT44(intra_atf_wgt[uVar15][3],intra_atf_wgt[uVar15][0]) & (ulong)DAT_002ad5f0;
      *(uint *)(lVar36 + 0x678) =
           (intra_atf_wgt[uVar15][8] & 0xffU) << 0x10 |
           (intra_atf_wgt[uVar15][7] & 0xffU) << 8 |
           (uint)*(byte *)(lVar36 + 0x67b) << 0x18 | (uint)(byte)intra_atf_wgt[uVar15][6];
      *(uint *)(lVar36 + 0x67c) = (uint)*(byte *)(lVar36 + 0x67f) << 0x18 | 0x101010;
      *(ulong *)(lVar36 + 0x6a8) =
           *(ulong *)(lVar36 + 0x6a8) & 0xf000f000f000f000 | (ulong)DAT_002ad620;
      *(undefined4 *)(lVar36 + 0x6c0) = 0x10101010;
      *(ulong *)(lVar36 + 0x6c4) =
           *(ulong *)(lVar36 + 0x6c4) & 0xff000000ff000000 | (ulong)DAT_002ad4c0;
      *(uint *)(lVar36 + 0x6cc) = (uint)*(byte *)(lVar36 + 0x6cf) << 0x18 | 0x101010;
      if (*(int *)(lVar30 + 0x2c) != 2) {
        *(ulong *)(lVar36 + 0x30c) =
             CONCAT44(atr_wgt[uVar15][5] << 0x10,atr_wgt[uVar15][2] << 0x10) & (ulong)DAT_002ad610 |
             CONCAT44(atr_wgt[uVar15][4] << 8,atr_wgt[uVar15][1] << 8) & (ulong)DAT_002ad600 |
             *(ulong *)(lVar36 + 0x30c) & DAT_002ad460 |
             CONCAT44(atr_wgt[uVar15][3],atr_wgt[uVar15][0]) & (ulong)DAT_002ad5f0;
        *(uint *)(lVar36 + 0x314) =
             (atr_wgt[uVar15][8] & 0xffU) << 0x10 |
             (atr_wgt[uVar15][7] & 0xffU) << 8 |
             (uint)*(byte *)(lVar36 + 0x317) << 0x18 | (uint)(byte)atr_wgt[uVar15][6];
      }
      *(ulong *)(lVar36 + 0x324) =
           CONCAT44(cime_multi[uVar15][3] << 0x10,4) & 0x3ff0000ffffffff |
           *(ulong *)(lVar36 + 0x324) & (ulong)DAT_002ad640 |
           CONCAT44(cime_multi[uVar15][2],cime_multi[uVar15][1] << 0x10) & (ulong)DAT_002ad630;
      *(uint *)(lVar36 + 0x330) =
           (rime_multi[uVar15][2] & 0x3ffU) * 0x100000 +
           (*(uint *)(lVar36 + 0x330) & 0xc0000000 | (rime_multi[uVar15][1] & 0x3ffU) << 10) + 4;
      if (*(int *)(lVar2 + 0x18c) != 0) {
        uVar15 = 0x2ab;
        if (*(uint *)(lVar2 + 0x184) != 0) {
          uVar15 = *(uint *)(lVar2 + 0x184) & 0x3ff;
        }
        uVar39 = *(uint *)(lVar36 + 0x2ec);
        *(uint *)(lVar36 + 0x2ec) = uVar39 & 0xfffffc00 | uVar15;
        uVar14 = 0x55400;
        if (*(uint *)(lVar2 + 0x188) != 0) {
          uVar14 = (*(uint *)(lVar2 + 0x188) & 0x3ff) << 10;
        }
        *(uint *)(lVar36 + 0x2ec) = uVar39 & 0xfff00000 | uVar15 | uVar14;
      }
    }
    else {
      _mpp_log_l(2,"hal_h264e_vepu580","scene_motion_flag is a wrong value %d\n",
                 "vepu580_h264e_tune_reg_patch");
    }
  }
  if (((ulong)pEVar4->frm & 4) != 0) {
    RVar16 = (*(int *)(*hal + 0x10) + 0xfU & 0x3fffff0) *
             (*(int *)(*hal + 0xc) + 0x3fU & 0xffffffc0);
    if ((*(long *)((long)hal + 0x198) == 0) &&
       (mpp_buffer_get_with_tag
                  ((MppBufferGroup)0x0,(MppBuffer *)((long)hal + 0x198),
                   (long)(int)(((int)RVar16 >> 1) + RVar16),"hal_h264e_vepu580",
                   "vepu580_h264e_save_pass1_patch"),
       *(MppBuffer *)((long)hal + 0x198) == (MppBuffer)0x0)) {
      _mpp_log_l(2,"hal_h264e_vepu580","buf_pass1 malloc fail, debreath invaild",(char *)0x0);
    }
    else {
      *(byte *)((long)__s + 0xe0) = *(byte *)((long)__s + 0xe0) | 4;
      iVar29 = mpp_buffer_get_fd_with_caller
                         (*(MppBuffer *)((long)hal + 0x198),"vepu580_h264e_save_pass1_patch");
      *(int *)((long)__s + 0x6c) = iVar29;
      *(int *)((long)__s + 0x70) = iVar29;
      *(byte *)((long)__s + 0xe3) = *(byte *)((long)__s + 0xe3) | 0x80;
      mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x38),0xa4,RVar16);
      *(byte *)((long)__s + 0x140) = *(byte *)((long)__s + 0x140) & 0xfe;
      *(byte *)((long)__s + 0xe3) = *(byte *)((long)__s + 0xe3) & 0xbf;
    }
  }
  if (((ulong)pEVar4->frm & 8) != 0) {
    uVar15 = *(int *)(*hal + 0xc) + 0x3f;
    RVar16 = (*(int *)(*hal + 0x10) + 0xfU & 0x3fffff0) * (uVar15 & 0xffffffc0);
    iVar29 = mpp_buffer_get_fd_with_caller
                       (*(MppBuffer *)((long)hal + 0x198),"vepu580_h264e_use_pass1_patch");
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","enter\n","vepu580_h264e_use_pass1_patch");
    }
    uVar8 = (ulong)DAT_002ad660;
    *(uint *)((long)__s + 0xf8) = *(uint *)((long)__s + 0xf8) & 0xffffff40 | 0x98;
    uVar35 = (ulong)DAT_002ad670;
    *(ulong *)((long)__s + 0x10c) = *(ulong *)((long)__s + 0x10c) & 0xc000c00083ffffff;
    *(ulong *)((long)__s + 0x114) =
         *(ulong *)((long)__s + 0x114) & uVar35 | CONCAT44(uVar15,uVar15) & uVar8;
    *(int *)((long)__s + 0x60) = iVar29;
    *(int *)((long)__s + 100) = iVar29;
    *(int *)((long)__s + 0x68) = iVar29;
    mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x38),0xa1,RVar16);
    mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)((long)hal + 0x38),0xa2,RVar16);
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu580","leave\n","vepu580_h264e_use_pass1_patch");
    }
  }
  *(int *)((long)hal + 0x10) = *(int *)((long)hal + 0x10) + 1;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave %p\n","hal_h264e_vepu580_gen_regs",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu580_gen_regs(void *hal, HalEncTask *task)
{
    HalH264eVepu580Ctx *ctx = (HalH264eVepu580Ctx *)hal;
    HalVepu580RegSet *regs = ctx->regs_set;
    MppEncCfgSet *cfg = ctx->cfg;
    H264eSps *sps = ctx->sps;
    H264ePps *pps = ctx->pps;
    H264eSlice *slice = ctx->slice;
    EncRcTask *rc_task = task->rc_task;
    EncFrmStatus *frm = &rc_task->frm;
    MPP_RET ret = MPP_OK;
    EncFrmStatus *frm_status = &task->rc_task->frm;

    hal_h264e_dbg_func("enter %p\n", hal);
    hal_h264e_dbg_detail("frame %d generate regs now", ctx->frms->seq_idx);

    /* register setup */
    memset(regs, 0, sizeof(*regs));

    setup_vepu580_normal(regs);
    ret = setup_vepu580_prep(regs, &ctx->cfg->prep, task);
    if (ret)
        return ret;

    setup_vepu580_dual_core(ctx, slice->slice_type);
    setup_vepu580_codec(regs, sps, pps, slice);
    setup_vepu580_rdo_pred(regs, sps, pps, slice);
    setup_vepu580_rdo_cfg(&regs->reg_rdo);
    setup_vepu580_rdo_bias_cfg(&regs->reg_rdo, &cfg->hw);

    // scl cfg
    memcpy(&regs->reg_scl, vepu580_540_h264_flat_scl_tab, sizeof(vepu580_540_h264_flat_scl_tab));

    setup_vepu580_rc_base(regs, ctx, rc_task);
    setup_vepu580_io_buf(regs, ctx->offsets, task);
    setup_vepu580_roi(regs, ctx);
    setup_vepu580_recn_refr(ctx, regs);

    regs->reg_base.meiw_addr = task->md_info ? mpp_buffer_get_fd(task->md_info) : 0;
    regs->reg_base.enc_pic.mei_stor = task->md_info ? 1 : 0;
    regs->reg_base.pic_ofst.pic_ofst_y = mpp_frame_get_offset_y(task->frame);
    regs->reg_base.pic_ofst.pic_ofst_x = mpp_frame_get_offset_x(task->frame);

    setup_vepu580_split(regs, cfg);
    setup_vepu580_me(regs, sps, slice);

    if (frm_status->is_i_refresh)
        setup_vepu580_intra_refresh(regs, ctx, frm_status->seq_idx % cfg->rc.gop);

    if (cfg->tune.deblur_en && (!rc_task->info.complex_scene) &&
        cfg->rc.rc_mode == MPP_ENC_RC_MODE_SMTRC &&
        cfg->tune.scene_mode == MPP_ENC_SCENE_MODE_IPC) {
        if (MPP_OK != setup_vepu580_qpmap_buf(ctx))
            mpp_err("qpmap malloc buffer failed!\n");
    }

    vepu580_set_osd(&ctx->osd_cfg);
    setup_vepu580_l2(regs, slice, &cfg->hw);
    setup_vepu580_ext_line_buf(regs, ctx);
    vepu580_h264e_tune_reg_patch(ctx->tune);

    /* two pass register patch */
    if (frm->save_pass1)
        vepu580_h264e_save_pass1_patch(regs, ctx);

    if (frm->use_pass1)
        vepu580_h264e_use_pass1_patch(regs, ctx);

    ctx->frame_cnt++;

    hal_h264e_dbg_func("leave %p\n", hal);
    return MPP_OK;
}